

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O3

uchar * ableton::link::v1::detail::
        encodeMessage<ableton::discovery::Payload<ableton::link::HostTime,ableton::discovery::Payload<ableton::link::PrevGHostTime,ableton::discovery::Payload<>>>,unsigned_char*>
                  (MessageType messageType,
                  Payload<ableton::link::HostTime,_ableton::discovery::Payload<ableton::link::PrevGHostTime,_ableton::discovery::Payload<>_>_>
                  *payload,uchar *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  out[0] = '_';
  out[1] = 'l';
  out[2] = 'i';
  out[3] = 'n';
  out[4] = 'k';
  out[5] = '_';
  out[6] = 'v';
  out[7] = '\x01';
  out[8] = messageType;
  uVar1 = (payload->mFirst).header.key;
  uVar2 = (payload->mFirst).header.size;
  *(uint *)(out + 9) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  *(uint *)(out + 0xd) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar3 = (payload->mFirst).value.time.__r;
  *(ulong *)(out + 0x11) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar1 = (payload->mRest).mFirst.header.key;
  uVar2 = (payload->mRest).mFirst.header.size;
  *(uint *)(out + 0x19) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  *(uint *)(out + 0x1d) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar3 = (payload->mRest).mFirst.value.time.__r;
  *(ulong *)(out + 0x21) =
       uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
       (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
       (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  return out + 0x29;
}

Assistant:

It encodeMessage(const MessageType messageType, const Payload& payload, It out)
{
  using namespace std;
  const MessageHeader header = {messageType};
  const auto messageSize =
    kProtocolHeader.size() + sizeInByteStream(header) + sizeInByteStream(payload);

  if (messageSize < kMaxMessageSize)
  {
    return toNetworkByteStream(
      payload, toNetworkByteStream(
                 header, copy(begin(kProtocolHeader), end(kProtocolHeader), move(out))));
  }
  else
  {
    throw range_error("Exceeded maximum message size");
  }
}